

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenVertexNormalsProcess.cpp
# Opt level: O0

bool __thiscall
Assimp::GenVertexNormalsProcess::GenMeshVertexNormals
          (GenVertexNormalsProcess *this,aiMesh *pMesh,uint meshIndex)

{
  uint uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Logger *this_00;
  ulong uVar4;
  ulong uVar5;
  aiVector3D *paVar6;
  aiVector3t<float> *paVar7;
  size_type sVar8;
  reference pvVar9;
  float *pfVar10;
  undefined8 *puVar11;
  float fVar12;
  double dVar13;
  aiVector3t<float> aVar14;
  reference rVar15;
  aiVector3t<float> *local_240;
  aiVector3t<float> *local_210;
  undefined1 local_1e8 [8];
  aiVector3D v_1;
  uint a_3;
  aiVector3D pcNor_1;
  aiVector3D vr;
  uint i_3;
  ai_real fLimit;
  _Bit_type local_1b0;
  uint local_1a8;
  uint local_1a4;
  uint vidx;
  uint a_2;
  aiVector3D *v;
  uint a_1;
  aiVector3D pcNor;
  uint local_178;
  allocator<bool> local_172;
  bool local_171;
  uint i_2;
  vector<bool,_std::allocator<bool>_> abHad;
  aiVector3D *pcNew;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  pair<Assimp::SpatialSort,_float> *blubb;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *local_110;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *avf;
  undefined1 local_100 [4];
  ai_real posEpsilon;
  SpatialSort _vertexFinder;
  SpatialSort *vertexFinder;
  float fStack_c8;
  uint i_1;
  float local_c0;
  aiVector3t<float> local_b8;
  aiVector3t<float> local_a8;
  aiVector3t<float> local_98;
  aiVector3t<float> local_88;
  aiVector3t<float> local_78;
  undefined8 local_6c;
  aiVector3D vNor;
  aiVector3D *pV3;
  aiVector3D *pV2;
  aiVector3D *pV1;
  float local_40;
  uint local_3c;
  aiFace *paStack_38;
  uint i;
  aiFace *face;
  float local_28;
  uint a;
  float qnan;
  uint meshIndex_local;
  aiMesh *pMesh_local;
  GenVertexNormalsProcess *this_local;
  
  a = meshIndex;
  _qnan = pMesh;
  pMesh_local = (aiMesh *)this;
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    if ((this->force_ & 1U) == 0) {
      this_local._7_1_ = 0;
      goto LAB_005ba298;
    }
    if (pMesh->mNormals != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mNormals);
    }
  }
  if ((_qnan->mPrimitiveTypes & 0xc) == 0) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Normal vectors are undefined for line and point meshes");
    this_local._7_1_ = 0;
  }
  else {
    local_28 = std::numeric_limits<float>::quiet_NaN();
    uVar4 = CONCAT44(0,_qnan->mNumVertices);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    uVar5 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    paVar6 = (aiVector3D *)operator_new__(uVar5);
    if (uVar4 != 0) {
      local_210 = paVar6;
      do {
        aiVector3t<float>::aiVector3t(local_210);
        local_210 = local_210 + 1;
      } while (local_210 != paVar6 + uVar4);
    }
    _qnan->mNormals = paVar6;
    for (face._4_4_ = 0; face._4_4_ < _qnan->mNumFaces; face._4_4_ = face._4_4_ + 1) {
      paStack_38 = _qnan->mFaces + face._4_4_;
      if (paStack_38->mNumIndices < 3) {
        for (local_3c = 0; local_3c < paStack_38->mNumIndices; local_3c = local_3c + 1) {
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)&pV1,NAN);
          paVar6 = _qnan->mNormals;
          uVar1 = paStack_38->mIndices[local_3c];
          *(aiVector3D **)(paVar6 + uVar1) = pV1;
          paVar6[uVar1].z = local_40;
        }
      }
      else {
        paVar6 = _qnan->mVertices;
        uVar1 = *paStack_38->mIndices;
        vNor._4_8_ = _qnan->mVertices + paStack_38->mIndices[paStack_38->mNumIndices - 1];
        aVar14 = ::operator-(_qnan->mVertices + paStack_38->mIndices[1],paVar6 + uVar1);
        local_98.z = aVar14.z;
        local_88.z = local_98.z;
        local_98._0_8_ = aVar14._0_8_;
        local_88.x = local_98.x;
        local_88.y = local_98.y;
        local_98 = aVar14;
        aVar14 = ::operator-((aiVector3t<float> *)vNor._4_8_,paVar6 + uVar1);
        local_b8.z = aVar14.z;
        local_a8.z = local_b8.z;
        local_b8._0_8_ = aVar14._0_8_;
        local_a8.x = local_b8.x;
        local_a8.y = local_b8.y;
        aVar14 = operator^(&local_88,&local_a8);
        _fStack_c8 = aVar14._0_8_;
        local_78.x = fStack_c8;
        local_78.y = (float)i_1;
        local_c0 = aVar14.z;
        local_78.z = local_c0;
        paVar7 = aiVector3t<float>::NormalizeSafe(&local_78);
        local_6c._0_4_ = paVar7->x;
        local_6c._4_4_ = paVar7->y;
        vNor.x = paVar7->z;
        for (vertexFinder._4_4_ = 0; vertexFinder._4_4_ < paStack_38->mNumIndices;
            vertexFinder._4_4_ = vertexFinder._4_4_ + 1) {
          paVar6 = _qnan->mNormals + paStack_38->mIndices[vertexFinder._4_4_];
          paVar6->x = (float)(undefined4)local_6c;
          paVar6->y = (float)local_6c._4_4_;
          paVar6->z = vNor.x;
        }
      }
    }
    _vertexFinder.mPositions.
    super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SpatialSort::SpatialSort((SpatialSort *)local_100);
    avf._4_4_ = 1e-05;
    if (((this->super_BaseProcess).shared != (SharedPostProcessInfo *)0x0) &&
       (SharedPostProcessInfo::
        GetProperty<std::vector<std::pair<Assimp::SpatialSort,float>,std::allocator<std::pair<Assimp::SpatialSort,float>>>>
                  ((this->super_BaseProcess).shared,"$Spat",&local_110),
       local_110 !=
       (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
        *)0x0)) {
      verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                    ::operator[](local_110,(ulong)a);
      avf._4_4_ = ((reference)
                  verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)->second;
      _vertexFinder.mPositions.
      super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    if (_vertexFinder.mPositions.
        super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      SpatialSort::Fill((SpatialSort *)local_100,_qnan->mVertices,_qnan->mNumVertices,0xc,true);
      _vertexFinder.mPositions.
      super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_100;
      avf._4_4_ = ComputePositionEpsilon(_qnan);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pcNew);
    uVar4 = (ulong)_qnan->mNumVertices;
    abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)operator_new__(uVar4 * 0xc);
    if (uVar4 != 0) {
      local_240 = (aiVector3t<float> *)
                  abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage;
      do {
        aiVector3t<float>::aiVector3t(local_240);
        local_240 = local_240 + 1;
      } while (local_240 !=
               (aiVector3t<float> *)
               ((long)abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage + uVar4 * 0xc));
    }
    if (this->configMaxAngle < 3.054326) {
      dVar13 = std::cos((double)(ulong)(uint)this->configMaxAngle);
      for (vr.y = 0.0; (uint)vr.y < _qnan->mNumVertices; vr.y = (float)((int)vr.y + 1)) {
        SpatialSort::FindPositions
                  ((SpatialSort *)
                   _vertexFinder.mPositions.
                   super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,_qnan->mVertices + (uint)vr.y,
                   avf._4_4_,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pcNew);
        pcNor_1.y = _qnan->mNormals[(uint)vr.y].x;
        pcNor_1.z = _qnan->mNormals[(uint)vr.y].y;
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&v_1.z);
        for (v_1.y = 0.0; uVar4 = (ulong)(uint)v_1.y,
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pcNew),
            uVar4 < sVar8; v_1.y = (float)((int)v_1.y + 1)) {
          paVar6 = _qnan->mNormals;
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pcNew,
                              (ulong)(uint)v_1.y);
          v_1.x = paVar6[*pvVar9].z;
          paVar6 = paVar6 + *pvVar9;
          local_1e8._0_4_ = paVar6->x;
          local_1e8._4_4_ = paVar6->y;
          bVar3 = is_not_qnan<float>(local_1e8._0_4_);
          if ((bVar3) &&
             ((pfVar10 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                  operator[]((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                             &pcNew,(ulong)(uint)v_1.y), *pfVar10 == vr.y ||
              (fVar12 = ::operator*((aiVector3t<float> *)local_1e8,(aiVector3t<float> *)&pcNor_1.y),
              SUB84(dVar13,0) <= fVar12)))) {
            aiVector3t<float>::operator+=
                      ((aiVector3t<float> *)&v_1.z,(aiVector3t<float> *)local_1e8);
          }
        }
        paVar7 = aiVector3t<float>::NormalizeSafe((aiVector3t<float> *)&v_1.z);
        puVar11 = (undefined8 *)
                  ((long)abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage + (ulong)(uint)vr.y * 0xc);
        *puVar11 = *(undefined8 *)paVar7;
        *(float *)(puVar11 + 1) = paVar7->z;
      }
    }
    else {
      uVar1 = _qnan->mNumVertices;
      local_171 = false;
      std::allocator<bool>::allocator(&local_172);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&i_2,(ulong)uVar1,&local_171,&local_172);
      std::allocator<bool>::~allocator(&local_172);
      for (local_178 = 0; local_178 < _qnan->mNumVertices; local_178 = local_178 + 1) {
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&i_2,(ulong)local_178);
        pcNor._4_8_ = rVar15._M_p;
        bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&pcNor.y);
        if (!bVar3) {
          SpatialSort::FindPositions
                    ((SpatialSort *)
                     _vertexFinder.mPositions.
                     super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,_qnan->mVertices + local_178
                     ,avf._4_4_,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pcNew);
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&v + 4));
          v._0_4_ = 0;
          while( true ) {
            uVar4 = (ulong)(uint)v;
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pcNew);
            if (sVar8 <= uVar4) break;
            paVar6 = _qnan->mNormals;
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pcNew,
                                (ulong)(uint)v);
            _vidx = paVar6 + *pvVar9;
            bVar3 = is_not_qnan<float>(_vidx->x);
            if (bVar3) {
              aiVector3t<float>::operator+=((aiVector3t<float> *)((long)&v + 4),_vidx);
            }
            v._0_4_ = (uint)v + 1;
          }
          aiVector3t<float>::NormalizeSafe((aiVector3t<float> *)((long)&v + 4));
          local_1a4 = 0;
          while( true ) {
            uVar4 = (ulong)local_1a4;
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pcNew);
            if (sVar8 <= uVar4) break;
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pcNew,
                                (ulong)local_1a4);
            local_1a8 = *pvVar9;
            *(float *)((long)abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + (ulong)local_1a8 * 0xc + 8
                      ) = pcNor.x;
            *(undefined8 *)
             ((long)abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + (ulong)local_1a8 * 0xc) =
                 stack0xfffffffffffffe6c;
            rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&i_2,(ulong)local_1a8);
            _i_3 = rVar15;
            std::_Bit_reference::operator=((_Bit_reference *)&i_3,true);
            local_1a4 = local_1a4 + 1;
          }
        }
      }
      std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i_2)
      ;
    }
    if (_qnan->mNormals != (aiVector3D *)0x0) {
      operator_delete__(_qnan->mNormals);
    }
    _qnan->mNormals =
         (aiVector3D *)
         abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_end_of_storage;
    this_local._7_1_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pcNew);
    SpatialSort::~SpatialSort((SpatialSort *)local_100);
  }
LAB_005ba298:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GenVertexNormalsProcess::GenMeshVertexNormals (aiMesh* pMesh, unsigned int meshIndex)
{
    if (NULL != pMesh->mNormals) {
        if (force_) delete[] pMesh->mNormals;
        else return false;
    }

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))
    {
        ASSIMP_LOG_INFO("Normal vectors are undefined for line and point meshes");
        return false;
    }

    // Allocate the array to hold the output normals
    const float qnan = std::numeric_limits<ai_real>::quiet_NaN();
    pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];

    // Compute per-face normals but store them per-vertex
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)
        {
            // either a point or a line -> no normal vector
            for (unsigned int i = 0;i < face.mNumIndices;++i) {
                pMesh->mNormals[face.mIndices[i]] = aiVector3D(qnan);
            }

            continue;
        }

        const aiVector3D* pV1 = &pMesh->mVertices[face.mIndices[0]];
        const aiVector3D* pV2 = &pMesh->mVertices[face.mIndices[1]];
        const aiVector3D* pV3 = &pMesh->mVertices[face.mIndices[face.mNumIndices-1]];
        const aiVector3D vNor = ((*pV2 - *pV1) ^ (*pV3 - *pV1)).NormalizeSafe();

        for (unsigned int i = 0;i < face.mNumIndices;++i) {
            pMesh->mNormals[face.mIndices[i]] = vNor;
        }
    }

    // Set up a SpatialSort to quickly find all vertices close to a given position
    // check whether we can reuse the SpatialSort of a previous step.
    SpatialSort* vertexFinder = NULL;
    SpatialSort  _vertexFinder;
    ai_real posEpsilon = ai_real( 1e-5 );
    if (shared) {
        std::vector<std::pair<SpatialSort,ai_real> >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)
        {
            std::pair<SpatialSort,ai_real>& blubb = avf->operator [] (meshIndex);
            vertexFinder = &blubb.first;
            posEpsilon = blubb.second;
        }
    }
    if (!vertexFinder)  {
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        posEpsilon = ComputePositionEpsilon(pMesh);
    }
    std::vector<unsigned int> verticesFound;
    aiVector3D* pcNew = new aiVector3D[pMesh->mNumVertices];

    if (configMaxAngle >= AI_DEG_TO_RAD( 175.f ))   {
        // There is no angle limit. Thus all vertices with positions close
        // to each other will receive the same vertex normal. This allows us
        // to optimize the whole algorithm a little bit ...
        std::vector<bool> abHad(pMesh->mNumVertices,false);
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
            if (abHad[i]) {
                continue;
            }

            // Get all vertices that share this one ...
            vertexFinder->FindPositions( pMesh->mVertices[i], posEpsilon, verticesFound);

            aiVector3D pcNor;
            for (unsigned int a = 0; a < verticesFound.size(); ++a) {
                const aiVector3D& v = pMesh->mNormals[verticesFound[a]];
                if (is_not_qnan(v.x))pcNor += v;
            }
            pcNor.NormalizeSafe();

            // Write the smoothed normal back to all affected normals
            for (unsigned int a = 0; a < verticesFound.size(); ++a)
            {
                unsigned int vidx = verticesFound[a];
                pcNew[vidx] = pcNor;
                abHad[vidx] = true;
            }
        }
    }
    // Slower code path if a smooth angle is set. There are many ways to achieve
    // the effect, this one is the most straightforward one.
    else    {
        const ai_real fLimit = std::cos(configMaxAngle);
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
            // Get all vertices that share this one ...
            vertexFinder->FindPositions( pMesh->mVertices[i] , posEpsilon, verticesFound);

            aiVector3D vr = pMesh->mNormals[i];

            aiVector3D pcNor;
            for (unsigned int a = 0; a < verticesFound.size(); ++a) {
                aiVector3D v = pMesh->mNormals[verticesFound[a]];

                // Check whether the angle between the two normals is not too large.
                // Skip the angle check on our own normal to avoid false negatives
                // (v*v is not guaranteed to be 1.0 for all unit vectors v)
                if (is_not_qnan(v.x) && (verticesFound[a] == i || (v * vr >= fLimit)))
                    pcNor += v;
            }
            pcNew[i] = pcNor.NormalizeSafe();
        }
    }

    delete[] pMesh->mNormals;
    pMesh->mNormals = pcNew;

    return true;
}